

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O3

int32_t __thiscall
icu_63::MessagePattern::parseSimpleStyle
          (MessagePattern *this,int32_t index,UParseError *parseError,UErrorCode *errorCode)

{
  ushort uVar1;
  char16_t cVar2;
  uint uVar3;
  uint start;
  int32_t iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  char16_t *pcVar9;
  uint uVar10;
  int iVar11;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
    uVar7 = (uint)(short)uVar1;
    uVar5 = (int)uVar7 >> 5;
    uVar6 = (this->msg).fUnion.fFields.fLength;
    uVar3 = uVar5;
    if ((short)uVar1 < 0) {
      uVar3 = uVar6;
    }
    if (index < (int)uVar3) {
      uVar8 = (uint)(uVar1 >> 0xf);
      iVar11 = 0;
      uVar10 = index;
      do {
        start = uVar10 + 1;
        if (uVar10 < uVar3) {
          pcVar9 = (char16_t *)((long)&(this->msg).fUnion + 2);
          if ((uVar7 & 2) == 0) {
            pcVar9 = (this->msg).fUnion.fFields.fArray;
          }
          cVar2 = pcVar9[(int)uVar10];
          if (cVar2 == L'}') {
            if (iVar11 < 1) {
              if (0xffff < (int)(uVar10 - index)) {
                setParseError(this,parseError,index);
                *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
              }
              addPart(this,UMSGPAT_PART_TYPE_ARG_STYLE,index,uVar10 - index,0,errorCode);
              return uVar10;
            }
            iVar11 = iVar11 + -1;
          }
          else if (cVar2 == L'{') {
            iVar11 = iVar11 + 1;
          }
          else if (cVar2 == L'\'') {
            if ((int)uVar10 < -1) {
              start = 0;
            }
            if (uVar8 != 0) {
              uVar5 = uVar6;
            }
            iVar4 = UnicodeString::doIndexOf(&this->msg,L'\'',start,uVar5 - start);
            if (iVar4 < 0) {
              setParseError(this,parseError,index);
              *errorCode = U_PATTERN_SYNTAX_ERROR;
              return 0;
            }
            start = iVar4 + 1;
            uVar7 = (uint)(ushort)(this->msg).fUnion.fStackFields.fLengthAndFlags;
            uVar6 = (this->msg).fUnion.fFields.fLength;
          }
        }
        uVar8 = (uVar7 & 0xffff) >> 0xf;
        uVar5 = (int)(short)uVar7 >> 5;
        uVar3 = uVar5;
        if ((short)uVar7 < 0) {
          uVar3 = uVar6;
        }
        uVar10 = start;
      } while ((int)start < (int)uVar3);
    }
    setParseError(this,parseError,0);
    *errorCode = U_UNMATCHED_BRACES;
  }
  return 0;
}

Assistant:

int32_t
MessagePattern::parseSimpleStyle(int32_t index, UParseError *parseError, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t start=index;
    int32_t nestedBraces=0;
    while(index<msg.length()) {
        UChar c=msg.charAt(index++);
        if(c==u_apos) {
            // Treat apostrophe as quoting but include it in the style part.
            // Find the end of the quoted literal text.
            index=msg.indexOf(u_apos, index);
            if(index<0) {
                // Quoted literal argument style text reaches to the end of the message.
                setParseError(parseError, start);
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            // skip the quote-ending apostrophe
            ++index;
        } else if(c==u_leftCurlyBrace) {
            ++nestedBraces;
        } else if(c==u_rightCurlyBrace) {
            if(nestedBraces>0) {
                --nestedBraces;
            } else {
                int32_t length=--index-start;
                if(length>Part::MAX_LENGTH) {
                    setParseError(parseError, start);  // Argument style text too long.
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
                addPart(UMSGPAT_PART_TYPE_ARG_STYLE, start, length, 0, errorCode);
                return index;
            }
        }  // c is part of literal text
    }
    setParseError(parseError, 0);  // Unmatched '{' braces in message.
    errorCode=U_UNMATCHED_BRACES;
    return 0;
}